

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlen.c
# Opt level: O3

ptrlen ptrlen_get_word(ptrlen *input,char *separators)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  ptrlen pVar7;
  
  pcVar1 = (char *)input->ptr;
  uVar2 = input->len;
  pcVar5 = pcVar1;
  pcVar6 = pcVar1;
  if (0 < (long)uVar2) {
    do {
      pcVar3 = strchr(separators,(int)*pcVar5);
      pcVar6 = pcVar5;
      if (pcVar3 == (char *)0x0) break;
      pcVar5 = pcVar5 + 1;
      pcVar6 = pcVar5;
    } while (pcVar5 < pcVar1 + uVar2);
  }
  while ((pcVar5 < pcVar1 + uVar2 &&
         (pcVar3 = strchr(separators,(int)*pcVar5), pcVar3 == (char *)0x0))) {
    pcVar5 = pcVar5 + 1;
  }
  uVar4 = (long)pcVar5 - (long)pcVar1;
  if (uVar2 < uVar4) {
    __assert_fail("to_consume <= input->len",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/ptrlen.c"
                  ,0x56,"ptrlen ptrlen_get_word(ptrlen *, const char *)");
  }
  input->ptr = pcVar1 + uVar4;
  input->len = uVar2 - uVar4;
  pVar7.len = (long)pcVar5 - (long)pcVar6;
  pVar7.ptr = pcVar6;
  return pVar7;
}

Assistant:

ptrlen ptrlen_get_word(ptrlen *input, const char *separators)
{
    const char *p = input->ptr, *end = p + input->len;
    ptrlen toret;

    while (p < end && strchr(separators, *p))
        p++;
    toret.ptr = p;
    while (p < end && !strchr(separators, *p))
        p++;
    toret.len = p - (const char *)toret.ptr;

    size_t to_consume = p - (const char *)input->ptr;
    assert(to_consume <= input->len);
    input->ptr = (const char *)input->ptr + to_consume;
    input->len -= to_consume;

    return toret;
}